

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O3

int __thiscall CMasterServer::Load(CMasterServer *this)

{
  long lVar1;
  IStorage *pIVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  char aAddrStr [48];
  char local_11b8 [128];
  NETADDR local_1138 [2];
  undefined4 local_1108;
  undefined8 local_10f8;
  CLineReader LineReader;
  IOHANDLE IoHandle;
  
  LineReader.m_aBuffer[0x20] = '\0';
  LineReader.m_aBuffer[0x21] = '\0';
  LineReader.m_aBuffer[0x22] = '\0';
  LineReader.m_aBuffer[0x23] = '\0';
  LineReader.m_aBuffer[0x24] = '\0';
  LineReader.m_aBuffer[0x25] = '\0';
  LineReader.m_aBuffer[0x26] = '\0';
  LineReader.m_aBuffer[0x27] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = this->m_pStorage;
  iVar4 = -1;
  if (pIVar2 != (IStorage *)0x0) {
    iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,"masters.cfg",9,0,0,0,0,0);
    IoHandle = (IOHANDLE)CONCAT44(extraout_var,iVar3);
    if (IoHandle != (IOHANDLE)0x0) {
      CLineReader::Init(&LineReader,IoHandle);
      memset(local_11b8,0,0x168);
      local_1108 = 2;
      local_10f8 = 0;
      pcVar5 = CLineReader::Get(&LineReader);
      if (pcVar5 != (char *)0x0) {
        do {
          iVar4 = __isoc99_sscanf(pcVar5,"%127s %47s",local_11b8,aAddrStr);
          if ((iVar4 == 2) && (iVar4 = net_addr_from_str(local_1138,aAddrStr), iVar4 == 0)) {
            local_1138[0].port = 0x205b;
            lVar6 = 0x10;
            do {
              pcVar5 = this->m_aMasterServers[0].m_aHostname + lVar6 + -0x10;
              iVar4 = str_comp(pcVar5,local_11b8);
              if (iVar4 == 0) goto LAB_001362c4;
              lVar6 = lVar6 + 0x168;
            } while (lVar6 != 0x5b0);
            lVar6 = 0;
            while (*(int *)(this->m_aMasterServers[0].m_Addr.ip + lVar6 + -4) != 0) {
              lVar6 = lVar6 + 0x168;
              if (lVar6 == 0x5a0) goto LAB_0013631a;
            }
            pcVar5 = this->m_aMasterServers[0].m_aHostname + lVar6;
LAB_001362c4:
            memcpy(pcVar5,local_11b8,0x168);
          }
          memset(local_11b8,0,0x168);
          local_1108 = 2;
          local_10f8 = 0;
          pcVar5 = CLineReader::Get(&LineReader);
        } while (pcVar5 != (char *)0x0);
      }
LAB_0013631a:
      io_close(IoHandle);
      iVar4 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

virtual int Load()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		CLineReader LineReader;
		LineReader.Init(File);
		while(1)
		{
			CMasterInfo Info = {{0}};
			const char *pLine = LineReader.Get();
			if(!pLine)
				break;

			// parse line
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(sscanf(pLine, "%127s %47s", Info.m_aHostname, aAddrStr) == 2 && net_addr_from_str(&Info.m_Addr, aAddrStr) == 0)
			{
				Info.m_Addr.port = MASTERSERVER_PORT;
				bool Added = false;
				for(int i = 0; i < MAX_MASTERSERVERS; ++i)
					if(str_comp(m_aMasterServers[i].m_aHostname, Info.m_aHostname) == 0)
					{
						m_aMasterServers[i] = Info;
						Added = true;
						break;
					}

				if(!Added)
				{
					for(int i = 0; i < MAX_MASTERSERVERS; ++i)
						if(m_aMasterServers[i].m_Addr.type == NETTYPE_INVALID)
						{
							m_aMasterServers[i] = Info;
							Added = true;
							break;
						}
				}

				if(!Added)
					break;
			}
		}

		io_close(File);
		return 0;
	}